

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_ref.cpp
# Opt level: O3

ON_SubDComponentRef * __thiscall
ON_SubDComponentRef::operator=(ON_SubDComponentRef *this,ON_SubDComponentRef *src)

{
  if (this != src) {
    ON_Object::operator=((ON_Object *)this,(ON_Object *)src);
    (this->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (src->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount,
               &(src->m_subd_ref).m_subd_sp.super___shared_ptr<ON_SubD,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    (this->m_component_ptr).m_ptr = (src->m_component_ptr).m_ptr;
    this->m_component_index = src->m_component_index;
    this->m_component_location = src->m_component_location;
    this->m_reference_id = src->m_reference_id;
  }
  return this;
}

Assistant:

ON_SubDComponentRef& ON_SubDComponentRef::operator=(const ON_SubDComponentRef& src)
{
  if (this != &src)
  {
    ON_Geometry::operator=(src);
    m_subd_ref = src.m_subd_ref;
    m_component_ptr = src.m_component_ptr;
    m_component_index = src.m_component_index;
    m_component_location = src.m_component_location;
    m_reference_id = src.m_reference_id;
  }
  return *this;
}